

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

int xmlInvokeConvImpl(xmlCharEncConvImpl impl,void *implCtxt,char *name,
                     xmlCharEncodingHandler *handler)

{
  int iVar1;
  undefined1 auStack_50 [4];
  int ret;
  xmlCharEncConverter conv;
  xmlCharEncodingHandler *handler_local;
  char *name_local;
  void *implCtxt_local;
  xmlCharEncConvImpl impl_local;
  
  conv.outputCtxt = handler;
  memset(auStack_50,0,0x28);
  iVar1 = (*impl)(implCtxt,name,(xmlCharEncConverter *)auStack_50);
  if (iVar1 == 0) {
    *(xmlCharEncConvFunc *)((long)conv.outputCtxt + 8) = _auStack_50;
    *(xmlCharEncConvFunc *)((long)conv.outputCtxt + 0x10) = conv.input;
    *(xmlCharEncConvFunc *)((long)conv.outputCtxt + 0x38) = conv.output;
    *(xmlCharEncConvCtxtDtor *)((long)conv.outputCtxt + 0x28) = conv.ctxtDtor;
    *(void **)((long)conv.outputCtxt + 0x30) = conv.inputCtxt;
  }
  return iVar1;
}

Assistant:

static int
xmlInvokeConvImpl(xmlCharEncConvImpl impl, void *implCtxt,
                  const char *name, xmlCharEncodingHandler *handler) {
    xmlCharEncConverter conv = { NULL, NULL, NULL, NULL, NULL };
    int ret;

    ret = impl(implCtxt, name, &conv);

    if (ret == XML_ERR_OK) {
        handler->input =
            (xmlCharEncodingInputFunc) (void (*)(void)) conv.input;
        handler->output =
            (xmlCharEncodingOutputFunc) (void (*)(void)) conv.output;
        handler->ctxtDtor = conv.ctxtDtor;
        handler->inputCtxt = conv.inputCtxt;
        handler->outputCtxt = conv.outputCtxt;
    }

    return(ret);
}